

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

void u_versionFromUString_63(uint8_t *versionArray,UChar *versionString)

{
  int32_t iVar1;
  int length;
  char versionChars [21];
  
  if (versionString != (UChar *)0x0 && versionArray != (uint8_t *)0x0) {
    iVar1 = u_strlen_63(versionString);
    length = 0x14;
    if (iVar1 < 0x14) {
      length = iVar1;
    }
    u_UCharsToChars_63(versionString,versionChars,length);
    versionChars[length] = '\0';
    u_versionFromString_63(versionArray,versionChars);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionFromUString(UVersionInfo versionArray, const UChar *versionString) {
    if(versionArray!=NULL && versionString!=NULL) {
        char versionChars[U_MAX_VERSION_STRING_LENGTH+1];
        int32_t len = u_strlen(versionString);
        if(len>U_MAX_VERSION_STRING_LENGTH) {
            len = U_MAX_VERSION_STRING_LENGTH;
        }
        u_UCharsToChars(versionString, versionChars, len);
        versionChars[len]=0;
        u_versionFromString(versionArray, versionChars);
    }
}